

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O2

int add_twin_operation_context_to_queue(TWIN_OPERATION_CONTEXT *twin_op_ctx)

{
  LIST_ITEM_HANDLE pLVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  pLVar1 = singlylinkedlist_add(twin_op_ctx->msgr->operations,twin_op_ctx);
  iVar3 = 0;
  if (pLVar1 == (LIST_ITEM_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x1c3;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      if ((ulong)twin_op_ctx->type < 6) {
        pcVar4 = TWIN_OPERATION_TYPEStringStorage[twin_op_ctx->type];
      }
      else {
        pcVar4 = "NULL";
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"add_twin_operation_context_to_queue",0x1c2,1,
                "Failed adding TWIN operation context to queue (%s, %s)",pcVar4,
                twin_op_ctx->correlation_id);
    }
  }
  return iVar3;
}

Assistant:

static int add_twin_operation_context_to_queue(TWIN_OPERATION_CONTEXT* twin_op_ctx)
{
    int result;

    if (singlylinkedlist_add(twin_op_ctx->msgr->operations, (const void*)twin_op_ctx) == NULL)
    {
        LogError("Failed adding TWIN operation context to queue (%s, %s)", MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, twin_op_ctx->type), twin_op_ctx->correlation_id);
        result = MU_FAILURE;
    }
    else
    {
        result = RESULT_OK;
    }

    return result;
}